

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O0

UniquePtr<EC_GROUP> NewSecp160r1Group(void)

{
  bool bVar1;
  int iVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  BIGNUM *b_00;
  pointer peVar5;
  pointer peVar6;
  __uniq_ptr_data<ec_group_st,_bssl::internal::Deleter,_true,_true> in_RDI;
  unique_ptr<ec_point_st,_bssl::internal::Deleter> local_68;
  UniquePtr<EC_POINT> g;
  UniquePtr<EC_GROUP> group;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_50;
  UniquePtr<BIGNUM> n;
  UniquePtr<BIGNUM> y;
  UniquePtr<BIGNUM> x;
  UniquePtr<BIGNUM> b;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_20;
  UniquePtr<BIGNUM> a;
  UniquePtr<BIGNUM> p;
  
  HexToBIGNUM((char *)&a);
  HexToBIGNUM((char *)&local_20);
  HexToBIGNUM((char *)&x);
  HexToBIGNUM((char *)&y);
  HexToBIGNUM((char *)&n);
  HexToBIGNUM((char *)&local_50);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&a);
  if ((((!bVar1) ||
       (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20), !bVar1)) ||
      (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&x), !bVar1)) ||
     (((bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&y), !bVar1 ||
       (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&n), !bVar1)) ||
      (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_50), !bVar1)))) {
    std::unique_ptr<ec_group_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ec_group_st,bssl::internal::Deleter> *)
               in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl,(nullptr_t)0x0);
    goto LAB_00445c9b;
  }
  pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&a);
  pBVar4 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
  b_00 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&x);
  peVar5 = (pointer)EC_GROUP_new_curve_GFp(pBVar3,pBVar4,b_00,(BN_CTX *)0x0);
  std::unique_ptr<ec_group_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ec_group_st,bssl::internal::Deleter> *)&g,peVar5);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&g);
  if (bVar1) {
    peVar5 = std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ec_group_st,_bssl::internal::Deleter> *)&g);
    peVar6 = (pointer)EC_POINT_new((EC_GROUP *)peVar5);
    std::unique_ptr<ec_point_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ec_point_st,bssl::internal::Deleter> *)&local_68,peVar6);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_68);
    if (bVar1) {
      peVar5 = std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ec_group_st,_bssl::internal::Deleter> *)&g);
      peVar6 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get(&local_68);
      pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&y);
      pBVar4 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&n);
      iVar2 = EC_POINT_set_affine_coordinates_GFp
                        ((EC_GROUP *)peVar5,(EC_POINT *)peVar6,pBVar3,pBVar4,(BN_CTX *)0x0);
      if (iVar2 == 0) goto LAB_00445c2d;
      peVar5 = std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ec_group_st,_bssl::internal::Deleter> *)&g);
      peVar6 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get(&local_68);
      pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_50);
      pBVar4 = BN_value_one();
      iVar2 = EC_GROUP_set_generator((EC_GROUP *)peVar5,(EC_POINT *)peVar6,pBVar3,pBVar4);
      if (iVar2 == 0) goto LAB_00445c2d;
      std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::unique_ptr
                ((unique_ptr<ec_group_st,_bssl::internal::Deleter> *)
                 in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl,
                 (unique_ptr<ec_group_st,_bssl::internal::Deleter> *)&g);
    }
    else {
LAB_00445c2d:
      std::unique_ptr<ec_group_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<ec_group_st,bssl::internal::Deleter> *)
                 in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl,(nullptr_t)0x0);
    }
    std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&local_68);
  }
  else {
    std::unique_ptr<ec_group_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ec_group_st,bssl::internal::Deleter> *)
               in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl,(nullptr_t)0x0);
  }
  std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_group_st,_bssl::internal::Deleter> *)&g);
LAB_00445c9b:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_50);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&n);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&y);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&x);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&a);
  return (__uniq_ptr_data<ec_group_st,_bssl::internal::Deleter,_true,_true>)
         (tuple<ec_group_st_*,_bssl::internal::Deleter>)
         in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<EC_GROUP> NewSecp160r1Group() {
  static const char kP[] = "ffffffffffffffffffffffffffffffff7fffffff";
  static const char kA[] = "ffffffffffffffffffffffffffffffff7ffffffc";
  static const char kB[] = "1c97befc54bd7a8b65acf89f81d4d4adc565fa45";
  static const char kX[] = "4a96b5688ef573284664698968c38bb913cbfc82";
  static const char kY[] = "23a628553168947d59dcc912042351377ac5fb32";
  static const char kN[] = "0100000000000000000001f4c8f927aed3ca752257";

  bssl::UniquePtr<BIGNUM> p = HexToBIGNUM(kP), a = HexToBIGNUM(kA),
                          b = HexToBIGNUM(kB), x = HexToBIGNUM(kX),
                          y = HexToBIGNUM(kY), n = HexToBIGNUM(kN);
  if (!p || !a || !b || !x || !y || !n) {
    return nullptr;
  }

  bssl::UniquePtr<EC_GROUP> group(
      EC_GROUP_new_curve_GFp(p.get(), a.get(), b.get(), nullptr));
  if (!group) {
    return nullptr;
  }
  bssl::UniquePtr<EC_POINT> g(EC_POINT_new(group.get()));
  if (!g ||
      !EC_POINT_set_affine_coordinates_GFp(group.get(), g.get(), x.get(),
                                           y.get(), nullptr) ||
      !EC_GROUP_set_generator(group.get(), g.get(), n.get(), BN_value_one())) {
    return nullptr;
  }
  return group;
}